

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeToggledCase::setupTest(DecodeToggledCase *this)

{
  undefined1 *puVar1;
  pointer pcVar2;
  int height;
  string *in_RCX;
  ComparisonFunction *paramsComparisonFunction;
  Vec4 *color;
  WrapMode wrapS;
  FragmentShaderParameters shaderParametersB;
  FragmentShaderParameters shaderParametersA;
  ComparisonFunction colorsEqualFunction;
  ComparisonFunction srgbToLinearFunction;
  WrapMode wrapT;
  _Alloc_hider _Var3;
  FilterMode in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 uStack_1d4;
  undefined4 in_stack_fffffffffffffe30;
  undefined1 local_1c8 [128];
  undefined1 local_148 [128];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ComparisonFunction local_a8;
  ComparisonFunction local_60;
  
  pcVar2 = local_148 + 0x10;
  local_148._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"srgbToLinearCheck","");
  puVar1 = local_1c8 + 0x10;
  local_1c8._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "mediump vec4 srgbToLinearCheck(in mediump vec4 texelSRGBA, in mediump vec4 texelLinear) \n{ \n\tconst int NUM_CHANNELS = 4;\tmediump vec4 texelSRGBAConverted; \n\tmediump vec4 epsilonErr = vec4(0.005); \n\tmediump vec4 testResult; \n\tfor (int idx = 0; idx < NUM_CHANNELS; idx++) \n\t{ \n\t\ttexelSRGBAConverted[idx] = pow( (texelSRGBA[idx] + 0.055) / 1.055, 1.0 / 0.4116); \n\t} \n\tif ( all(lessThan(abs(texelSRGBAConverted - texelLinear), epsilonErr)) || all(equal(texelSRGBAConverted, texelLinear)) ) \n\t{ \n\t\treturn testResult = vec4(0.0, 1.0, 0.0, 1.0); \n\t} \n\telse \n\t{ \n\t\treturn testResult = vec4(1.0, 0.0, 0.0, 1.0); \n\t} \n} \n"
             ,"");
  ComparisonFunction::ComparisonFunction
            (&local_60,(string *)local_148,(FunctionParameters)local_1c8,in_RCX);
  if ((undefined1 *)local_1c8._0_8_ != puVar1) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  if ((pointer)local_148._0_8_ != pcVar2) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  local_148._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"colorsEqualCheck","");
  local_1c8._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "mediump vec4 colorsEqualCheck(in mediump vec4 colorA, in mediump vec4 colorB) \n{ \n\tmediump vec4 epsilonErr = vec4(0.005); \n\tmediump vec4 testResult; \n\tif ( all(lessThan(abs(colorA - colorB), epsilonErr)) || all(equal(colorA, colorB)) ) \n\t{ \n\t\treturn testResult = vec4(0.0, 1.0, 0.0, 1.0); \n\t} \n\telse \n\t{ \n\t\treturn testResult = vec4(1.0, 0.0, 0.0, 1.0); \n\t} \n} \n"
             ,"");
  ComparisonFunction::ComparisonFunction
            (&local_a8,(string *)local_148,(FunctionParameters)local_1c8,in_RCX);
  if ((undefined1 *)local_1c8._0_8_ != puVar1) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  if ((pointer)local_148._0_8_ != pcVar2) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  FragmentShaderParameters::FragmentShaderParameters
            ((FragmentShaderParameters *)local_148,SHADEROUTPUTS_ONE,SHADERUNIFORMS_TWO,&local_60,
             BLENDING_NOT_REQUIRED,TOGGLING_NOT_REQUIRED);
  paramsComparisonFunction = &local_a8;
  color = (Vec4 *)0x0;
  wrapS = CLAMP_TO_EDGE;
  FragmentShaderParameters::FragmentShaderParameters
            ((FragmentShaderParameters *)local_1c8,SHADEROUTPUTS_ONE,SHADERUNIFORMS_TWO,
             paramsComparisonFunction,BLENDING_REQUIRED,TOGGLING_REQUIRED);
  height = (int)paramsComparisonFunction;
  _Var3._M_p = &stack0xfffffffffffffe28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe18,"uTexture0","")
  ;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_1c8 + 0x68)
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xfffffffffffffe18);
  if (_Var3._M_p != &stack0xfffffffffffffe28) {
    operator_delete(_Var3._M_p,CONCAT44(uStack_1d4,in_stack_fffffffffffffe28) + 1);
  }
  local_b8 = 0x3e99999a3e4ccccd;
  uStack_b0 = 0x3f8000003ecccccd;
  wrapT = (WrapMode)_Var3._M_p;
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,(TextureType)&local_b8,0,height,color,wrapS,wrapT,
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,in_stack_fffffffffffffe30);
  local_c8 = 0x3e99999a3e4ccccd;
  uStack_c0 = 0x3f8000003ecccccd;
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,(TextureType)&local_c8,1,height,color,wrapS,wrapT,
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,in_stack_fffffffffffffe30);
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,(FragmentShaderParameters *)local_148);
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,(FragmentShaderParameters *)local_1c8);
  (this->super_SRGBTestCase).m_py = 0;
  (this->super_SRGBTestCase).m_samplingGroup = SHADERSAMPLINGGROUP_TEXTURE;
  (this->super_SRGBTestCase).m_px = 0;
  FragmentShaderParameters::~FragmentShaderParameters((FragmentShaderParameters *)local_1c8);
  FragmentShaderParameters::~FragmentShaderParameters((FragmentShaderParameters *)local_148);
  ComparisonFunction::~ComparisonFunction(&local_a8);
  ComparisonFunction::~ComparisonFunction(&local_60);
  return;
}

Assistant:

void DecodeToggledCase::setupTest (void)
{
	// TEST STEPS:
	//	- create and set texture_a to DECODE_SKIP_EXT and texture_b to DECODE_EXT
	//	- create and use two seperate shader programs, program_a and program_b, each using different fragment shaders
	//	- store texture_a and texture_b on GPU
	// FIRST PASS:
	//	- use program_a
	//	- in fragment shader, sample both textures using texture*() and manually perform sRGB to lRGB conversion on texture_a
	//	- in fragment shader, test converted texture_a value with texture_b
	//	- render green image for pass or red for fail
	//	- store result in a color attachement 0
	// TOGGLE STAGE
	//	- during rendering, toggle texture_a from DECODE_SKIP_EXT to DECODE_EXT
	// SECOND PASS:
	//	- use program_b
	//	- in fragment shader, sample both textures using texture*() and manually perform equality check. Both should be linear
	//	- blend first pass result with second pass. Anything but a green result equals fail

	ComparisonFunction srgbToLinearFunction("srgbToLinearCheck", FUNCTIONPARAMETERS_TWO, getFunctionDefinitionSRGBToLinearCheck());
	ComparisonFunction colorsEqualFunction("colorsEqualCheck", FUNCTIONPARAMETERS_TWO, getFunctionDefinitionEqualCheck());

	FragmentShaderParameters shaderParametersA(SHADEROUTPUTS_ONE, SHADERUNIFORMS_TWO, &srgbToLinearFunction, BLENDING_NOT_REQUIRED, TOGGLING_NOT_REQUIRED);
	FragmentShaderParameters shaderParametersB(SHADEROUTPUTS_ONE, SHADERUNIFORMS_TWO, &colorsEqualFunction, BLENDING_REQUIRED, TOGGLING_REQUIRED);

	// need to specify which texture uniform to toggle DECODE_EXT/SKIP_DECODE_EXT
	shaderParametersB.uniformsToToggle.push_back("uTexture0");

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_SKIP_DECODE);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_DECODE);

	this->addShaderProgram(shaderParametersA);
	this->addShaderProgram(shaderParametersB);

	this->setSamplingLocations(TestSamplingPositions::X_POS, TestSamplingPositions::Y_POS);
	this->setSamplingGroup(SHADERSAMPLINGGROUP_TEXTURE);
}